

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

string * poplar::
         short_realname<poplar::map<poplar::compact_bonsai_trie<90u,4u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>,poplar::compact_bonsai_nlm<int,16ul>>>
                   (void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  realname<poplar::map<poplar::compact_bonsai_trie<90u,4u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>,poplar::compact_bonsai_nlm<int,16ul>>>
            ();
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_50," |poplar::",0x10);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&local_30,in_RDI,&local_50,"",0);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_50,"(\\d+)ul{0,2}",0x10);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&local_30,in_RDI,&local_50,"$1",0);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
  return in_RDI;
}

Assistant:

inline std::string short_realname() {
    auto name = realname<T>();
    name = std::regex_replace(name, std::regex{R"( |poplar::)"}, "");
    name = std::regex_replace(name, std::regex{R"((\d+)ul{0,2})"}, "$1");
    return name;
}